

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast.c
# Opt level: O3

xy * aom_fast9_detect_nonmax
               (byte *im,int xsize,int ysize,int stride,int b,int **ret_scores,int *ret_num_corners)

{
  undefined8 in_RAX;
  xy *corners;
  int *scores;
  xy *pxVar1;
  int num_corners;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  corners = aom_fast9_detect(im,xsize,ysize,stride,b,&local_34);
  if (corners != (xy *)0x0) {
    scores = aom_fast9_score(im,stride,corners,local_34,b);
    if (local_34 < 1 || scores != (int *)0x0) {
      pxVar1 = aom_nonmax_suppression(corners,scores,local_34,ret_scores,ret_num_corners);
      free(corners);
      free(scores);
      return pxVar1;
    }
    free(corners);
  }
  *ret_num_corners = -1;
  return (xy *)0x0;
}

Assistant:

xy* aom_fast9_detect_nonmax(const byte* im, int xsize, int ysize, int stride, int b,
                            int** ret_scores, int* ret_num_corners)
{
  xy* corners;
  int num_corners;
  int* scores;
  xy* nonmax;

  corners = aom_fast9_detect(im, xsize, ysize, stride, b, &num_corners);
  if(!corners)
  {
    // Memory allocation failure
    *ret_num_corners = -1;
    return NULL;
  }
  // num_corners may be zero.
  scores = aom_fast9_score(im, stride, corners, num_corners, b);
  if(!scores && num_corners > 0)
  {
    // Memory allocation failure
    free(corners);
    *ret_num_corners = -1;
    return NULL;
  }
  nonmax = aom_nonmax_suppression(corners, scores, num_corners, ret_scores, ret_num_corners);

  free(corners);
  free(scores);

  return nonmax;
}